

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

void xmlBufGetChildContent(xmlBufPtr buf,xmlNode *tree)

{
  xmlNode *pxVar1;
  _xmlNode *ref;
  
  pxVar1 = tree->children;
  while( true ) {
    ref = pxVar1;
    if (ref == (xmlNode *)0x0) {
      return;
    }
    if (ref->type - XML_TEXT_NODE < 2) break;
    if (ref->type == XML_ENTITY_REF_NODE) {
      xmlBufGetEntityRefContent(buf,ref);
      goto LAB_0014d30c;
    }
    pxVar1 = ref->children;
    if (ref->children == (_xmlNode *)0x0) {
LAB_0014d30c:
      while (pxVar1 = ref->next, ref->next == (_xmlNode *)0x0) {
        ref = ref->parent;
        if (ref == tree) {
          return;
        }
      }
    }
  }
  xmlBufCat(buf,ref->content);
  goto LAB_0014d30c;
}

Assistant:

static void
xmlBufGetChildContent(xmlBufPtr buf, const xmlNode *tree) {
    const xmlNode *cur = tree->children;

    while (cur != NULL) {
        switch (cur->type) {
            case XML_TEXT_NODE:
            case XML_CDATA_SECTION_NODE:
                xmlBufCat(buf, cur->content);
                break;

            case XML_ENTITY_REF_NODE:
                xmlBufGetEntityRefContent(buf, cur);
                break;

            default:
                if (cur->children != NULL) {
                    cur = cur->children;
                    continue;
                }
                break;
        }

        while (cur->next == NULL) {
            cur = cur->parent;
            if (cur == tree)
                return;
        }
        cur = cur->next;
    }
}